

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_partial
              (char *src,char *dst,int compressedSize,int targetOutputSize,int dstCapacity)

{
  ushort *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  undefined8 uVar6;
  ushort uVar7;
  ushort uVar8;
  U32 length;
  uint uVar9;
  uint uVar10;
  ushort *puVar11;
  int iVar12;
  ushort *puVar13;
  ulong uVar14;
  char cVar15;
  long lVar16;
  byte *pbVar17;
  ulong uVar18;
  byte *pbVar19;
  byte *pbVar20;
  BYTE *d;
  ulong uVar21;
  byte *unaff_R14;
  BYTE *s;
  ushort *puVar22;
  ushort *puStack_a0;
  int local_68;
  
  if (targetOutputSize < dstCapacity) {
    dstCapacity = targetOutputSize;
  }
  puVar11 = (ushort *)0xffffffffffffffff;
  if (src != (char *)0x0) {
    if (dstCapacity == 0) {
      puVar11 = (ushort *)0x0;
    }
    else if (compressedSize != 0) {
      puVar2 = (ushort *)(src + compressedSize);
      pbVar3 = (byte *)(dst + dstCapacity);
      pbVar17 = (byte *)dst;
      puVar13 = (ushort *)src;
      if (dstCapacity < 0x40) goto LAB_00102e6b;
      puVar1 = (ushort *)((long)puVar2 - 0xf);
      puVar11 = (ushort *)src;
LAB_00102921:
      pbVar20 = pbVar17;
      bVar5 = (byte)*puVar11;
      uVar10 = (uint)bVar5;
      puVar22 = (ushort *)((long)puVar11 + 1);
      uVar18 = (ulong)(uint)(bVar5 >> 4);
      puVar13 = puVar22;
      if (bVar5 >> 4 == 0xf) {
        uVar18 = 0xf;
        if (puVar22 < puVar1) {
          uVar9 = 0;
          do {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar9 = uVar9 + (byte)uVar7;
          } while (puVar13 < puVar1 && (byte)uVar7 == 0xff);
          uVar18 = (ulong)uVar9 + 0xf;
        }
        pbVar17 = pbVar20 + uVar18;
        if (((puVar1 <= puVar22) || (CARRY8((ulong)pbVar20,uVar18))) ||
           (CARRY8((ulong)puVar13,uVar18))) {
          iVar12 = 5;
        }
        else {
          unaff_R14 = pbVar17;
          if ((pbVar3 + -0x20 < pbVar17) || (puVar2 + -0x10 < (ushort *)((long)puVar13 + uVar18))) {
            iVar12 = 6;
          }
          else {
            lVar16 = 0;
            do {
              uVar6 = *(undefined8 *)((byte *)((long)puVar13 + lVar16) + 8);
              pbVar19 = pbVar20 + lVar16;
              *(undefined8 *)pbVar19 = *(undefined8 *)((long)puVar13 + lVar16);
              *(undefined8 *)(pbVar19 + 8) = uVar6;
              pbVar4 = (byte *)((long)puVar13 + lVar16 + 0x10);
              uVar6 = *(undefined8 *)(pbVar4 + 8);
              *(undefined8 *)(pbVar19 + 0x10) = *(undefined8 *)pbVar4;
              *(undefined8 *)(pbVar19 + 0x18) = uVar6;
              lVar16 = lVar16 + 0x20;
            } while (pbVar19 + 0x20 < pbVar17);
            iVar12 = 0;
            puVar13 = (ushort *)((long)puVar13 + uVar18);
            pbVar20 = pbVar17;
          }
        }
        puVar11 = puVar13;
        if (iVar12 != 0) {
          if (iVar12 != 5) {
            if (iVar12 == 6) goto LAB_00102c9f;
            goto LAB_00102e8f;
          }
          goto LAB_00102e7c;
        }
      }
      else {
        unaff_R14 = pbVar20 + uVar18;
        if ((ushort *)((long)puVar2 - 0x11U) < puVar22) goto LAB_00102c9f;
        uVar6 = *(undefined8 *)((long)puVar11 + 9);
        *(undefined8 *)pbVar20 = *(undefined8 *)puVar22;
        *(undefined8 *)(pbVar20 + 8) = uVar6;
        puVar11 = (ushort *)(uVar18 + (long)puVar22);
        pbVar20 = unaff_R14;
      }
      uVar7 = *puVar11;
      uVar14 = (ulong)uVar7;
      puVar13 = puVar11 + 1;
      pbVar19 = pbVar20 + -uVar14;
      uVar18 = (ulong)(bVar5 & 0xf);
      if (uVar18 == 0xf) {
        if (pbVar19 < dst) {
          iVar12 = 5;
          puStack_a0 = (ushort *)0xf;
        }
        else {
          uVar10 = 0;
          do {
            uVar8 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar10 = uVar10 + (byte)uVar8;
          } while ((byte)uVar8 == 0xff && puVar13 < puVar2 + -2);
          puVar11 = (ushort *)(ulong)uVar10;
          puStack_a0 = (ushort *)((long)puVar11 + 0xf);
          if (puVar13 < puVar2 + -2) {
            if (CARRY8((ulong)pbVar20,(ulong)puStack_a0)) {
              iVar12 = 5;
            }
            else {
              pbVar17 = pbVar20 + (long)puVar11;
              puVar11 = (ushort *)((long)puVar11 + 0x13);
              iVar12 = 7;
              puStack_a0 = puVar11;
              if (pbVar17 + 0x13 < pbVar3 + -0x40) {
                iVar12 = 0;
              }
            }
          }
          else {
            iVar12 = 5;
          }
        }
        if (iVar12 != 0) {
          if (iVar12 != 5) {
            if (iVar12 != 7) goto LAB_00102e8f;
            goto LAB_00102db1;
          }
          goto LAB_00102e7c;
        }
      }
      else {
        puStack_a0 = (ushort *)(uVar18 + 4);
        if (pbVar3 + -0x40 <= pbVar20 + uVar18 + 4) goto LAB_00102db1;
        if ((dst <= pbVar19) && (7 < uVar7)) {
          *(undefined8 *)pbVar20 = *(undefined8 *)pbVar19;
          *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar19 + 8);
          *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar19 + 0x10);
          pbVar17 = pbVar20 + uVar18 + 4;
          puVar11 = puVar13;
          goto LAB_00102921;
        }
      }
      if (pbVar19 < dst) goto LAB_00102e7c;
      unaff_R14 = (byte *)((long)puStack_a0 + (long)pbVar20);
      pbVar17 = unaff_R14;
      puVar11 = puVar13;
      if (uVar7 < 0x10) {
        LZ4_memcpy_using_offset(pbVar20,pbVar19,unaff_R14,uVar14);
      }
      else {
        do {
          uVar6 = *(undefined8 *)(pbVar20 + -uVar14 + 8);
          *(undefined8 *)pbVar20 = *(undefined8 *)(pbVar20 + -uVar14);
          *(undefined8 *)(pbVar20 + 8) = uVar6;
          uVar6 = *(undefined8 *)(pbVar20 + -uVar14 + 0x10 + 8);
          *(undefined8 *)(pbVar20 + 0x10) = *(undefined8 *)(pbVar20 + -uVar14 + 0x10);
          *(undefined8 *)(pbVar20 + 0x18) = uVar6;
          pbVar20 = pbVar20 + 0x20;
        } while (pbVar20 < unaff_R14);
      }
      goto LAB_00102921;
    }
  }
LAB_00102e8f:
  return (int)puVar11;
LAB_00102db1:
  if (pbVar19 < dst) goto LAB_00102e7c;
  pbVar17 = pbVar20 + (long)puStack_a0;
  if (pbVar3 + -0xc < pbVar17) {
    puVar11 = (ushort *)(pbVar3 + -(long)pbVar20);
    if (puStack_a0 < pbVar3 + -(long)pbVar20) {
      puVar11 = puStack_a0;
    }
    pbVar17 = pbVar20 + (long)puVar11;
    if (pbVar20 < pbVar19 + (long)puVar11) {
      if (0 < (long)puVar11) {
        do {
          bVar5 = *pbVar19;
          pbVar19 = pbVar19 + 1;
          *pbVar20 = bVar5;
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 < pbVar17);
      }
    }
    else {
      memcpy(pbVar20,pbVar19,(size_t)puVar11);
    }
    if (pbVar17 != pbVar3) goto LAB_00102e6b;
LAB_00102e89:
    puVar11 = (ushort *)(ulong)(uint)((int)pbVar17 - (int)dst);
    goto LAB_00102e8f;
  }
  if ((uint)uVar14 < 8) {
    pbVar20[0] = 0;
    pbVar20[1] = 0;
    pbVar20[2] = 0;
    pbVar20[3] = 0;
    *pbVar20 = *pbVar19;
    pbVar20[1] = pbVar19[1];
    pbVar20[2] = pbVar19[2];
    pbVar20[3] = pbVar19[3];
    uVar18 = (ulong)((uint)uVar14 << 2);
    uVar14 = (ulong)*(uint *)((long)inc32table + uVar18);
    *(undefined4 *)(pbVar20 + 4) = *(undefined4 *)(pbVar19 + uVar14);
    pbVar19 = pbVar19 + (uVar14 - (long)*(int *)((long)dec64table + uVar18));
  }
  else {
    *(undefined8 *)pbVar20 = *(undefined8 *)pbVar19;
    pbVar19 = pbVar19 + 8;
  }
  *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)pbVar19;
  if ((ushort *)0x10 < puStack_a0) {
    pbVar20 = pbVar20 + 0x10;
    do {
      pbVar19 = pbVar19 + 8;
      *(undefined8 *)pbVar20 = *(undefined8 *)pbVar19;
      pbVar20 = pbVar20 + 8;
    } while (pbVar20 < pbVar17);
  }
LAB_00102e6b:
  pbVar20 = pbVar17;
  bVar5 = (byte)*puVar13;
  puVar11 = (ushort *)((long)puVar13 + 1);
  while( true ) {
    uVar10 = (uint)bVar5;
    if (bVar5 >> 4 == 0xf) break;
    uVar18 = (ulong)(uint)(bVar5 >> 4);
    if ((src + (long)compressedSize + -0x10 <= puVar11) ||
       (dst + (long)dstCapacity + -0x20 < pbVar20)) goto LAB_00102c98;
    uVar6 = *(undefined8 *)(puVar11 + 4);
    *(undefined8 *)pbVar20 = *(undefined8 *)puVar11;
    *(undefined8 *)(pbVar20 + 8) = uVar6;
    pbVar20 = pbVar20 + uVar18;
    uVar21 = (ulong)(uVar10 & 0xf);
    puVar13 = (ushort *)((long)puVar11 + uVar18) + 1;
    uVar7 = *(ushort *)((long)puVar11 + uVar18);
    uVar14 = (ulong)uVar7;
    pbVar19 = pbVar20 + -uVar14;
    if ((((uVar10 & 0xf) == 0xf) || (uVar7 < 8)) || (pbVar19 < dst)) goto LAB_00102d3d;
    *(undefined8 *)pbVar20 = *(undefined8 *)pbVar19;
    *(undefined8 *)(pbVar20 + 8) = *(undefined8 *)(pbVar19 + 8);
    *(undefined2 *)(pbVar20 + 0x10) = *(undefined2 *)(pbVar19 + 0x10);
    pbVar20 = pbVar20 + uVar21 + 4;
    bVar5 = *(byte *)((long)puVar11 + uVar18 + 2);
    puVar11 = (ushort *)((long)puVar11 + uVar18 + 3);
  }
  puVar1 = (ushort *)((long)puVar2 - 0xf);
  uVar18 = 0xf;
  puVar13 = puVar11;
  if (puVar11 < puVar1) {
    uVar9 = 0;
    do {
      uVar7 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar9 = uVar9 + (byte)uVar7;
    } while (puVar13 < puVar1 && (byte)uVar7 == 0xff);
    uVar18 = (ulong)uVar9 + 0xf;
  }
  if (((puVar1 <= puVar11) || (CARRY8((ulong)pbVar20,uVar18))) ||
     (puVar11 = puVar13, CARRY8((ulong)puVar13,uVar18))) goto LAB_00102e7c;
LAB_00102c98:
  unaff_R14 = pbVar20 + uVar18;
  puVar13 = puVar11;
LAB_00102c9f:
  puVar11 = (ushort *)((long)puVar13 + uVar18);
  if ((pbVar3 + -0xc < unaff_R14) || (pbVar17 = pbVar20, puVar2 + -4 < puVar11)) {
    if (puVar2 + -4 < puVar11 && puVar11 != puVar2) goto LAB_00102e7c;
    if (pbVar3 < unaff_R14) {
      uVar18 = (long)pbVar3 - (long)pbVar20;
    }
    memmove(pbVar20,puVar13,uVar18);
    pbVar17 = pbVar20 + uVar18;
    if ((pbVar3 <= unaff_R14) ||
       (puVar11 = (ushort *)((long)puVar13 + uVar18), pbVar20 = pbVar17, puVar11 == puVar2))
    goto LAB_00102e89;
  }
  else {
    do {
      *(undefined8 *)pbVar17 = *(undefined8 *)puVar13;
      pbVar17 = pbVar17 + 8;
      puVar13 = puVar13 + 4;
      pbVar20 = unaff_R14;
    } while (pbVar17 < unaff_R14);
  }
  uVar14 = (ulong)*puVar11;
  puVar13 = puVar11 + 1;
  pbVar19 = pbVar20 + -uVar14;
  uVar21 = (ulong)(uVar10 & 0xf);
LAB_00102d3d:
  if ((int)uVar21 == 0xf) {
    uVar10 = 0;
    do {
      uVar7 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar10 = uVar10 + (byte)uVar7;
    } while (puVar13 < puVar2 + -2 && (byte)uVar7 == 0xff);
    uVar21 = (ulong)uVar10 + 0xf;
    cVar15 = '\x05';
    if (puVar13 < puVar2 + -2) {
      cVar15 = CARRY8((ulong)pbVar20,uVar21) * '\x05';
    }
    if (cVar15 != '\0') {
      puVar11 = puVar13;
      if (cVar15 != '\x05') goto LAB_00102e8f;
      goto LAB_00102e7c;
    }
  }
  puStack_a0 = (ushort *)(uVar21 + 4);
  goto LAB_00102db1;
LAB_00102e7c:
  local_68 = (int)src;
  puVar11 = (ushort *)(ulong)(~(uint)puVar13 + local_68);
  goto LAB_00102e8f;
}

Assistant:

LZ4_FORCE_O2_GCC_PPC64LE
int LZ4_decompress_safe_partial(const char* src, char* dst, int compressedSize, int targetOutputSize, int dstCapacity)
{
    dstCapacity = MIN(targetOutputSize, dstCapacity);
    return LZ4_decompress_generic(src, dst, compressedSize, dstCapacity,
                                  endOnInputSize, partial_decode,
                                  noDict, (BYTE*)dst, NULL, 0);
}